

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O0

Compaction * __thiscall leveldb::VersionSet::PickCompaction(VersionSet *this)

{
  Version *pVVar1;
  FileMetaData *pFVar2;
  byte bVar3;
  bool bVar4;
  int iVar5;
  VersionSet *pVVar6;
  FileMetaData *pFVar7;
  reference ppFVar8;
  undefined1 local_98 [8];
  InternalKey largest;
  InternalKey smallest;
  Slice local_48;
  value_type local_38;
  FileMetaData *f;
  size_t i;
  bool seek_compaction;
  bool size_compaction;
  VersionSet *pVStack_20;
  int level;
  Compaction *c;
  VersionSet *this_local;
  
  i._3_1_ = 1.0 <= this->current_->compaction_score_;
  i._2_1_ = this->current_->file_to_compact_ != (FileMetaData *)0x0;
  c = (Compaction *)this;
  if ((bool)i._3_1_) {
    i._4_4_ = this->current_->compaction_level_;
    if (i._4_4_ < 0) {
      __assert_fail("level >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/version_set.cc"
                    ,0x4e9,"Compaction *leveldb::VersionSet::PickCompaction()");
    }
    if (6 < i._4_4_ + 1) {
      __assert_fail("level + 1 < config::kNumLevels",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/version_set.cc"
                    ,0x4ea,"Compaction *leveldb::VersionSet::PickCompaction()");
    }
    pVVar6 = (VersionSet *)operator_new(0x158);
    Compaction::Compaction((Compaction *)pVVar6,this->options_,i._4_4_);
    pVStack_20 = pVVar6;
    for (f = (FileMetaData *)0x0; pFVar2 = f,
        pFVar7 = (FileMetaData *)
                 std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::
                 size(this->current_->files_ + i._4_4_), pFVar2 < pFVar7;
        f = (FileMetaData *)((long)&f->refs + 1)) {
      ppFVar8 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::
                operator[](this->current_->files_ + i._4_4_,(size_type)f);
      local_38 = *ppFVar8;
      bVar3 = std::__cxx11::string::empty();
      bVar4 = true;
      if ((bVar3 & 1) == 0) {
        local_48 = InternalKey::Encode(&local_38->largest);
        Slice::Slice((Slice *)((long)&smallest.rep_.field_2 + 8),
                     (string *)(&this->field_0x170 + (long)i._4_4_ * 0x20));
        iVar5 = InternalKeyComparator::Compare
                          (&this->icmp_,&local_48,(Slice *)((long)&smallest.rep_.field_2 + 8));
        bVar4 = 0 < iVar5;
      }
      if (bVar4) {
        std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::push_back
                  ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
                   &(pVStack_20->dummy_versions_).files_[1].
                    super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish,&local_38);
        break;
      }
    }
    bVar4 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::empty
                      ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
                       &(pVStack_20->dummy_versions_).files_[1].
                        super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish);
    if (bVar4) {
      pVVar1 = &pVStack_20->dummy_versions_;
      ppFVar8 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::
                operator[](this->current_->files_ + i._4_4_,0);
      std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::push_back
                ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
                 &pVVar1->files_[1].
                  super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish,ppFVar8);
    }
  }
  else {
    if (!(bool)i._2_1_) {
      return (Compaction *)(VersionSet *)0x0;
    }
    i._4_4_ = this->current_->file_to_compact_level_;
    pVVar6 = (VersionSet *)operator_new(0x158);
    Compaction::Compaction((Compaction *)pVVar6,this->options_,i._4_4_);
    pVStack_20 = pVVar6;
    std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::push_back
              ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
               &(pVVar6->dummy_versions_).files_[1].
                super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                ._M_impl.super__Vector_impl_data._M_finish,&this->current_->file_to_compact_);
  }
  (pVStack_20->dbname_)._M_string_length = (size_type)this->current_;
  Version::Ref((Version *)(pVStack_20->dbname_)._M_string_length);
  if (i._4_4_ == 0) {
    InternalKey::InternalKey((InternalKey *)((long)&largest.rep_.field_2 + 8));
    InternalKey::InternalKey((InternalKey *)local_98);
    GetRange(this,(vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
                  &(pVStack_20->dummy_versions_).files_[1].
                   super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
             (InternalKey *)((long)&largest.rep_.field_2 + 8),(InternalKey *)local_98);
    Version::GetOverlappingInputs
              (this->current_,0,(InternalKey *)((long)&largest.rep_.field_2 + 8),
               (InternalKey *)local_98,
               (vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
               &(pVStack_20->dummy_versions_).files_[1].
                super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                ._M_impl.super__Vector_impl_data._M_finish);
    bVar4 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::empty
                      ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
                       &(pVStack_20->dummy_versions_).files_[1].
                        super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish);
    if (((bVar4 ^ 0xffU) & 1) == 0) {
      __assert_fail("!c->inputs_[0].empty()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/version_set.cc"
                    ,0x50d,"Compaction *leveldb::VersionSet::PickCompaction()");
    }
    InternalKey::~InternalKey((InternalKey *)local_98);
    InternalKey::~InternalKey((InternalKey *)((long)&largest.rep_.field_2 + 8));
  }
  SetupOtherInputs(this,(Compaction *)pVStack_20);
  return (Compaction *)pVStack_20;
}

Assistant:

Compaction* VersionSet::PickCompaction() {
  Compaction* c;
  int level;

  // We prefer compactions triggered by too much data in a level over
  // the compactions triggered by seeks.
  const bool size_compaction = (current_->compaction_score_ >= 1);
  const bool seek_compaction = (current_->file_to_compact_ != nullptr);
  if (size_compaction) {
    level = current_->compaction_level_;
    assert(level >= 0);
    assert(level + 1 < config::kNumLevels);
    c = new Compaction(options_, level);

    // Pick the first file that comes after compact_pointer_[level]
    for (size_t i = 0; i < current_->files_[level].size(); i++) {
      FileMetaData* f = current_->files_[level][i];
      if (compact_pointer_[level].empty() ||
          icmp_.Compare(f->largest.Encode(), compact_pointer_[level]) > 0) {
        c->inputs_[0].push_back(f);
        break;
      }
    }
    if (c->inputs_[0].empty()) {
      // Wrap-around to the beginning of the key space
      c->inputs_[0].push_back(current_->files_[level][0]);
    }
  } else if (seek_compaction) {
    level = current_->file_to_compact_level_;
    c = new Compaction(options_, level);
    c->inputs_[0].push_back(current_->file_to_compact_);
  } else {
    return nullptr;
  }

  c->input_version_ = current_;
  c->input_version_->Ref();

  // Files in level 0 may overlap each other, so pick up all overlapping ones
  if (level == 0) {
    InternalKey smallest, largest;
    GetRange(c->inputs_[0], &smallest, &largest);
    // Note that the next call will discard the file we placed in
    // c->inputs_[0] earlier and replace it with an overlapping set
    // which will include the picked file.
    current_->GetOverlappingInputs(0, &smallest, &largest, &c->inputs_[0]);
    assert(!c->inputs_[0].empty());
  }

  SetupOtherInputs(c);

  return c;
}